

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O0

size_t __thiscall
lineage::heuristics::PartitionGraph::frameOfPartition(PartitionGraph *this,size_t partitionId)

{
  bool bVar1;
  runtime_error *this_00;
  size_t sVar2;
  size_type in_RSI;
  long in_RDI;
  value_type_conflict anyVertexOfPartition;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffb8;
  ProblemGraph *in_stack_ffffffffffffffc0;
  
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x80),in_RSI);
  bVar1 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x1c5631);
  if (!bVar1) {
    std::
    vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0x80),in_RSI);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::cbegin(in_stack_ffffffffffffffb8);
    std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
              ((_Node_const_iterator<unsigned_long,_true,_false> *)0x1c56b9);
    sVar2 = ProblemGraph::frameOfNode(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    return sVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Partition is empty and thus not associated with a frame.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t frameOfPartition(size_t partitionId) const
    {
        if (partitions_[partitionId].empty()) {
            throw std::runtime_error(
                "Partition is empty and thus not associated with a frame.");
        }

        const auto anyVertexOfPartition = *partitions_[partitionId].cbegin();
        return this->data_.problemGraph.frameOfNode(anyVertexOfPartition);
    }